

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
            MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  pointer pcVar1;
  StringRefType local_10;
  
  (this->data_).n = (Number)0x0;
  (this->data_).s.str = (Ch *)0x0;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_10.length = (SizeType)s->_M_string_length;
  local_10.s = "";
  if (pcVar1 != (pointer)0x0) {
    local_10.s = pcVar1;
  }
  if (local_10.length == 0 || pcVar1 != (pointer)0x0) {
    SetStringRaw(this,&local_10,allocator);
    return;
  }
  __assert_fail("str != 0 || len == 0u",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x191,
                "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
               );
}

Assistant:

GenericValue(const std::basic_string<Ch>& s, Allocator& allocator) : data_() { SetStringRaw(StringRef(s), allocator); }